

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int getCoreTemp(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  float temp;
  char buffer [256];
  float local_12c;
  char local_128 [264];
  
  local_12c = 0.0;
  __stream = popen("/opt/vc/bin/vcgencmd measure_temp 2>&1","r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -0x1e;
  }
  else {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      do {
        pcVar2 = fgets(local_128,0x100,__stream);
        if (pcVar2 != (char *)0x0) {
          __isoc99_sscanf(local_128,"temp=%f\'C",&local_12c);
        }
        iVar1 = feof(__stream);
      } while (iVar1 == 0);
    }
    pclose(__stream);
    iVar1 = (int)local_12c + -0x1e;
  }
  return iVar1;
}

Assistant:

int getCoreTemp()
{
	float temp = 0.;
    FILE * stream;
    const int max_buffer = 256;
    char buffer[max_buffer];
    
    stream = popen("/opt/vc/bin/vcgencmd measure_temp 2>&1", "r");	
    if (stream) {
		while (!feof(stream))
			if (fgets(buffer, max_buffer, stream) != NULL) 
			{					
				sscanf(buffer, "temp=%f'C", &temp);				
			}
		pclose(stream);
    }
    return ((int)temp - 30);
}